

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactor<double>::updateNoClear
          (CLUFactor<double> *this,int p_col,double *p_work,int *p_idx,int num)

{
  pointer pdVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  double dVar10;
  double dVar11;
  
  dVar10 = 1.0 / p_work[p_col];
  iVar4 = makeLvec(this,num,p_col);
  pdVar1 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->l).idx;
  iVar8 = p_idx[(long)num + -1];
  if (iVar8 != p_col) {
    piVar9 = p_idx + (num + -1);
    lVar5 = 0;
    do {
      piVar9 = piVar9 + -1;
      piVar2[iVar4 + lVar5] = iVar8;
      pdVar1[iVar4 + lVar5] = p_work[iVar8] * dVar10;
      iVar8 = *piVar9;
      lVar5 = lVar5 + 1;
    } while (iVar8 != p_col);
    iVar4 = iVar4 + (int)lVar5;
    num = num - (int)lVar5;
  }
  lVar5 = (long)iVar4;
  piVar2[lVar5] = p_col;
  pdVar1[lVar5] = 1.0 - dVar10;
  if (1 < num) {
    lVar5 = lVar5 * 2;
    lVar6 = (ulong)(num - 2) + 1;
    do {
      lVar5 = lVar5 + 2;
      iVar8 = p_idx[lVar6 + -1];
      *(int *)((long)piVar2 + lVar5 * 2) = iVar8;
      dVar11 = p_work[iVar8];
      *(double *)((long)pdVar1 + lVar5 * 4) = dVar11 * dVar10;
      dVar11 = ABS(dVar11 * dVar10);
      if (this->maxabs <= dVar11 && dVar11 != this->maxabs) {
        this->maxabs = dVar11;
      }
      lVar7 = lVar6 + -1;
      bVar3 = 0 < lVar6;
      lVar6 = lVar7;
    } while (lVar7 != 0 && bVar3);
  }
  this->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}